

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::score_basename_word_prefix_match
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this)

{
  bool bVar1;
  bool bVar2;
  __normal_iterator<const_cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
  *this_00;
  reference p_Var3;
  reference pcVar4;
  unsigned_long *puVar5;
  pointer pCVar6;
  difference_type dVar7;
  long in_RDI;
  bool any_word_matches;
  CharCount current_submatch;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  query_word_last;
  __normal_iterator<const___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>_>
  qit_words_it;
  const_iterator query_last;
  Iterator query_it;
  __normal_iterator<const_cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
  props_it;
  Iterator item_it;
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  char32_t in_stack_ffffffffffffff84;
  unsigned_long local_58;
  char32_t *local_50;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> *local_48;
  __normal_iterator<const___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>_>
  local_40;
  char32_t *local_38;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> local_30;
  char32_t *local_28;
  CharProperties *local_20;
  __normal_iterator<const_cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
  local_18;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  local_10 [2];
  
  local_10[0]._M_current = *(char32_t **)(in_RDI + 0x20);
  local_20 = (CharProperties *)
             std::
             vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
             ::cbegin((vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
                       *)in_stack_ffffffffffffff78);
  this_00 = (__normal_iterator<const_cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
             *)(in_RDI + 0x20);
  local_28 = (char32_t *)
             std::vector<char32_t,_std::allocator<char32_t>_>::cbegin
                       ((vector<char32_t,_std::allocator<char32_t>_> *)in_stack_ffffffffffffff78);
  __gnu_cxx::operator-
            ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
              *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
              *)in_stack_ffffffffffffff78);
  local_18 = __gnu_cxx::
             __normal_iterator<const_cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
             ::operator+(this_00,CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  local_30._M_current = *(char32_t **)(in_RDI + 0x40);
  local_38 = (char32_t *)
             std::vector<char32_t,_std::allocator<char32_t>_>::cend
                       ((vector<char32_t,_std::allocator<char32_t>_> *)in_stack_ffffffffffffff78);
  local_48 = (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
              *)std::
                vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
                ::cbegin(in_stack_ffffffffffffff78);
  local_40 = __gnu_cxx::
             __normal_iterator<const___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>_>
             ::operator+((__normal_iterator<const___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>_>
                          *)this_00,CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  p_Var3 = __gnu_cxx::
           __normal_iterator<const___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>_>
           ::operator*(&local_40);
  local_50 = p_Var3->_M_current;
  local_58 = 0;
  bVar1 = false;
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                        *)in_stack_ffffffffffffff78);
    if (bVar2) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
               ::operator*(local_10);
      in_stack_ffffffffffffff84 = *pcVar4;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
               ::operator*(&local_30);
      if (in_stack_ffffffffffffff84 != *pcVar4) goto LAB_001a357c;
      __gnu_cxx::
      __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
      operator++(&local_30);
      local_58 = local_58 + 1;
      bVar1 = true;
      bVar2 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                          *)in_stack_ffffffffffffff78);
      if (bVar2) {
        puVar5 = std::max<unsigned_long>((unsigned_long *)(in_RDI + 0x68),&local_58);
        *(unsigned_long *)(in_RDI + 0x68) = *puVar5;
        std::vector<char32_t,_std::allocator<char32_t>_>::cend
                  ((vector<char32_t,_std::allocator<char32_t>_> *)in_stack_ffffffffffffff78);
        dVar7 = __gnu_cxx::operator-
                          ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                            *)in_stack_ffffffffffffff78);
        *(difference_type *)(in_RDI + 0x90) = dVar7 + -1;
        return;
      }
    }
    else {
LAB_001a357c:
      puVar5 = std::max<unsigned_long>((unsigned_long *)(in_RDI + 0x68),&local_58);
      *(unsigned_long *)(in_RDI + 0x68) = *puVar5;
      local_58 = 0;
    }
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
    operator++(local_10);
    __gnu_cxx::
    __normal_iterator<const_cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
    ::operator++(&local_18);
    pCVar6 = __gnu_cxx::
             __normal_iterator<const_cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
             ::operator->(&local_18);
    if ((pCVar6->word_start & 1U) != 0) {
      if (!bVar1) {
        *(long *)(in_RDI + 0x78) = *(long *)(in_RDI + 0x78) + 1;
      }
      bVar1 = false;
      __gnu_cxx::
      __normal_iterator<const___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>_>
      ::operator++(&local_40);
      p_Var3 = __gnu_cxx::
               __normal_iterator<const___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>_>
               ::operator*(&local_40);
      local_50 = p_Var3->_M_current;
    }
  } while( true );
}

Assistant:

void score_basename_word_prefix_match() {
    auto item_it = item_basename_;
    auto props_it = props_.cbegin() + (item_basename_ - item_.cbegin());
    auto query_it = qit_basename_;
    auto const query_last = query_.cend();
    // +1 because the first iteration of the loop skips the word start at the
    // beginning of the basename.
    auto qit_words_it = qit_basename_words_.cbegin() + 1;
    auto query_word_last = *qit_words_it;

    CharCount current_submatch = 0;
    bool any_word_matches = false;

    while (true) {
      if (query_it != query_word_last && *item_it == *query_it) {
        ++query_it;
        current_submatch++;
        any_word_matches = true;
        if (query_it == query_last) {
          break;
        }
      } else {
        basename_longest_submatch_ =
            std::max(basename_longest_submatch_, current_submatch);
        current_submatch = 0;
      }
      ++item_it;
      // At this point we know that the basename *is* a word prefix match, so
      // fully consuming the end of the query should be the only possible way
      // to leave this loop. Hence we skip the comparison to `item_.cend()`.
      // (The same applies to `qit_words_it` and `qit_basename_words_.cend()`
      // below.)
      ++props_it;
      if (props_it->word_start) {
        if (!any_word_matches) {
          basename_word_gaps_++;
        }
        any_word_matches = false;
        ++qit_words_it;
        query_word_last = *qit_words_it;
      }
    }
    basename_longest_submatch_ =
        std::max(basename_longest_submatch_, current_submatch);
    // -1 here because we broke out upon reaching the last match (`query_it ==
    // query_last`) before incrementing `item_it`.
    unmatched_suffix_len_ = item_.cend() - item_it - 1;
  }